

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyParser_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::insert_move(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyParser_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,Node *keyval)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint8_t *puVar2;
  byte bVar3;
  pointer pcVar4;
  undefined8 uVar5;
  bool bVar6;
  size_t sVar7;
  uint8_t *puVar8;
  long lVar9;
  string *this_00;
  uint uVar10;
  
  if (this->mMaxNumElementsAllowed == 0) {
    bVar6 = try_increase_info(this);
    if (!bVar6) {
      throwOverflowError(this);
    }
  }
  sVar7 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               keyval);
  uVar10 = ((uint)sVar7 & 0x1f) >> ((byte)this->mInfoHashShift & 0x3f);
  sVar7 = sVar7 >> 5 & this->mMask;
  puVar8 = this->mInfo;
  bVar3 = puVar8[sVar7];
  while (uVar10 = uVar10 + this->mInfoInc, uVar10 <= bVar3) {
    lVar9 = sVar7 + 1;
    sVar7 = sVar7 + 1;
    bVar3 = puVar8[lVar9];
  }
  if (0xff < (uVar10 & 0xff) + this->mInfoInc) {
    this->mMaxNumElementsAllowed = 0;
  }
  lVar9 = 1;
  do {
    lVar9 = lVar9 + -1;
    puVar2 = puVar8 + sVar7;
    puVar8 = puVar8 + 1;
  } while (*puVar2 != '\0');
  this_00 = (string *)(this->mKeyVals + sVar7);
  if (lVar9 == 0) {
    *(string **)this_00 = this_00 + 0x10;
    pcVar4 = (keyval->mData).first._M_dataplus._M_p;
    paVar1 = &(keyval->mData).first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar1) {
      uVar5 = *(undefined8 *)((long)&(keyval->mData).first.field_2 + 8);
      *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
      *(undefined8 *)(this_00 + 0x18) = uVar5;
    }
    else {
      *(pointer *)this_00 = pcVar4;
      *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
    }
    *(size_type *)(this_00 + 8) = (keyval->mData).first._M_string_length;
    (keyval->mData).first._M_dataplus._M_p = (pointer)paVar1;
    (keyval->mData).first._M_string_length = 0;
    (keyval->mData).first.field_2._M_local_buf[0] = '\0';
  }
  else {
    shiftUp(this,sVar7 - lVar9,sVar7);
    std::__cxx11::string::operator=(this_00,(string *)keyval);
  }
  *(PropertyParser **)(this_00 + 0x20) = (keyval->mData).second;
  this->mInfo[sVar7] = (uint8_t)uVar10;
  this->mNumElements = this->mNumElements + 1;
  return sVar7;
}

Assistant:

size_t insert_move(Node&& keyval) {
        // we don't retry, fail if overflowing
        // don't need to check max num elements
        if (0 == mMaxNumElementsAllowed && !try_increase_info()) {
            throwOverflowError(); // impossible to reach LCOV_EXCL_LINE
        }

        size_t idx{};
        InfoType info{};
        keyToIdx(keyval.getFirst(), &idx, &info);

        // skip forward. Use <= because we are certain that the element is not there.
        while (info <= mInfo[idx]) {
            idx = idx + 1;
            info += mInfoInc;
        }

        // key not found, so we are now exactly where we want to insert it.
        auto const insertion_idx = idx;
        auto const insertion_info = static_cast<uint8_t>(info);
        if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
            mMaxNumElementsAllowed = 0;
        }

        // find an empty spot
        while (0 != mInfo[idx]) {
            next(&info, &idx);
        }

        auto& l = mKeyVals[insertion_idx];
        if (idx == insertion_idx) {
            ::new (static_cast<void*>(&l)) Node(std::move(keyval));
        } else {
            shiftUp(idx, insertion_idx);
            l = std::move(keyval);
        }

        // put at empty spot
        mInfo[insertion_idx] = insertion_info;

        ++mNumElements;
        return insertion_idx;
    }